

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (str->_M_string_length & 0xffffffff) + 1;
  do {
    if ((int)lVar4 + -2 < 0) goto LAB_00109152;
    iVar2 = isspace((int)(str->_M_dataplus)._M_p[(int)lVar4 - 2U & 0x7fffffff]);
    lVar4 = lVar4 + -1;
  } while (iVar2 != 0);
  pcVar1 = (str->_M_dataplus)._M_p;
  lVar3 = 0;
  do {
    iVar2 = isspace((int)pcVar1[lVar3]);
    if (iVar2 == 0) break;
    lVar3 = lVar3 + 1;
  } while (lVar4 != lVar3);
LAB_00109152:
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

string trim(string str) {
   int finish = str.length() - 1;
   while (finish >= 0 && isspace(str[finish])) {
      finish--;
   }
   int start = 0;
   while (start <= finish && isspace(str[start])) {
      start++;
   }
   return str.substr(start, finish - start + 1);
}